

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O2

DoubleVector * __thiscall CoreML::Specification::Imputer::mutable_imputeddoublearray(Imputer *this)

{
  DoubleVector *this_00;
  
  if (this->_oneof_case_[0] == 4) {
    this_00 = (DoubleVector *)(this->ImputedValue_).imputeddoublevalue_;
  }
  else {
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 4;
    this_00 = (DoubleVector *)operator_new(0x28);
    DoubleVector::DoubleVector(this_00);
    (this->ImputedValue_).imputeddoublearray_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::DoubleVector* Imputer::mutable_imputeddoublearray() {
  if (!has_imputeddoublearray()) {
    clear_ImputedValue();
    set_has_imputeddoublearray();
    ImputedValue_.imputeddoublearray_ = new ::CoreML::Specification::DoubleVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.imputedDoubleArray)
  return ImputedValue_.imputeddoublearray_;
}